

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

longdouble *
chaiscript::boxed_cast<long_double>
          (longdouble *__return_storage_ptr__,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  undefined8 *puVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  longdouble *extraout_RAX;
  longdouble *plVar5;
  undefined8 *puVar6;
  Type_Conversions_State *extraout_RDX;
  Type_Conversions_State *extraout_RDX_00;
  Boxed_Value BVar7;
  undefined1 local_48 [16];
  uint local_38;
  undefined4 uStack_34;
  
  if (bv != (Boxed_Value *)0x0) {
    local_48._0_8_ = &long_double::typeinfo;
    local_48._8_8_ = &long_double::typeinfo;
    local_38 = 0x10;
    bVar4 = Type_Info::bare_equal(*(Type_Info **)__return_storage_ptr__,(Type_Info *)local_48);
    t_conversions = extraout_RDX;
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<long_double>
                          ((Type_Conversions *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr), t_conversions = extraout_RDX_00, bVar4)) {
      bVar4 = Type_Conversions::convertable_type<long_double>
                        ((Type_Conversions *)
                         (bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (bVar4) {
        BVar7 = Type_Conversions::boxed_type_conversion<long_double>
                          ((Type_Conversions *)local_48,
                           (Conversion_Saves *)
                           (bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(Boxed_Value *)
                                   (bv->m_data).
                                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
        detail::Cast_Helper_Inner<long_double>::cast
                  ((longdouble *)local_48,bv,
                   (Type_Conversions_State *)
                   BVar7.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
        return extraout_RAX;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      puVar1 = *(undefined8 **)__return_storage_ptr__;
      _local_38 = puVar1[2];
      ptVar2 = (type_info *)*puVar1;
      ptVar3 = (type_info *)puVar1[1];
      *puVar6 = &PTR__bad_cast_00697c18;
      local_48._0_4_ = SUB84(ptVar2,0);
      local_48._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
      local_48._8_4_ = SUB84(ptVar3,0);
      local_48._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      *(undefined4 *)(puVar6 + 1) = local_48._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_48._4_4_;
      *(undefined4 *)(puVar6 + 2) = local_48._8_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = local_48._12_4_;
      puVar6[3] = _local_38;
      puVar6[4] = &long_double::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_48._0_8_ = ptVar2;
      local_48._8_8_ = ptVar3;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  plVar5 = detail::Cast_Helper_Inner<long_double>::cast(__return_storage_ptr__,bv,t_conversions);
  return plVar5;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }